

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordManager.cpp
# Opt level: O2

void __thiscall
RecordManager::FindandPrint
          (RecordManager *this,STMT *S,set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *ps)

{
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> target;
  _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_> _Stack_138;
  _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_> local_108;
  _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_> local_d8;
  undefined1 local_a8 [72];
  undefined1 local_60 [72];
  
  STMT::STMT((STMT *)local_60,S);
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::_Rb_tree
            (&local_108,&ps->_M_t);
  FindSuchRecord((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_d8,this,
                 (STMT *)local_60,(set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_108);
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::~_Rb_tree
            (&local_108);
  std::__cxx11::string::~string((string *)(local_60 + 8));
  STMT::STMT((STMT *)local_a8,S);
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::_Rb_tree
            (&_Stack_138,&local_d8);
  PrintRecord(this,(STMT *)local_a8,(set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&_Stack_138
             );
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::~_Rb_tree
            (&_Stack_138);
  std::__cxx11::string::~string((string *)(local_a8 + 8));
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::~_Rb_tree
            (&local_d8);
  return;
}

Assistant:

void RecordManager::FindandPrint(STMT S, set<Addr>ps) {
	set<Addr> target = this->FindSuchRecord(S, ps);
	this->PrintRecord(S, target);
}